

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

int hello_world_object_impl_interface_create(object obj,object_impl impl)

{
  bool bVar1;
  char *message;
  undefined1 *in_RSI;
  AssertionResult gtest_ar;
  hello_world_object hello_world;
  void **in_stack_ffffffffffffff90;
  AssertionResult *this;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  AssertHelper in_stack_ffffffffffffffa8;
  Message local_50 [4];
  undefined8 local_30;
  AssertionResult local_28;
  undefined1 *local_18;
  
  local_30 = 0;
  this = &local_28;
  local_18 = in_RSI;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)in_stack_ffffffffffffffa8.data_,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),(void **)this,
             in_stack_ffffffffffffff90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x10bc1a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffa8,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    testing::Message::~Message((Message *)0x10bc68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bca8);
  *local_18 = 100;
  *(undefined8 *)(local_18 + 8) = 0x37;
  return 0;
}

Assistant:

int hello_world_object_impl_interface_create(object obj, object_impl impl)
{
	hello_world_object hello_world = (hello_world_object)impl;

	(void)obj;

	EXPECT_NE((void *)NULL, (void *)hello_world);

	// Default values for static attributes (this will be done automatically by the language runtime)
	hello_world->d = 'd';
	hello_world->e = 55;

	return 0;
}